

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_prepro.h
# Opt level: O1

void __thiscall
mp::
ConstraintPreprocessors<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>
::
PreprocessConstraint<mp::PreprocessInfo<mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<_1>>>>,mp::LinTerms,_1>
          (ConstraintPreprocessors<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>
           *this,ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>
                 *cc,
          PreprocessInfo<mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>_>
          *prepro)

{
  LinTerms *this_00;
  double dVar1;
  int iVar2;
  pointer pcVar3;
  bool bVar4;
  Var VVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  double dVar9;
  double dVar10;
  AlgConRhs<1> rr;
  Arguments arg1;
  PreprocessInfoStd bnt;
  long *local_2b8 [2];
  long local_2a8 [2];
  inline_storage<double,_6U> *local_298;
  ulong local_290;
  long local_288;
  inline_storage<double,_6U> local_280;
  inline_storage<int,_6U> *local_250;
  ulong local_248;
  long local_240;
  inline_storage<int,_6U> local_238;
  double local_220;
  LinTerms local_218;
  ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_> local_1a0;
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_> local_d0;
  
  bVar4 = CheckEmptySubCon<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<_1>>,mp::PreprocessInfo<mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<_1>>>>>
                    (this,cc,prepro);
  if (!bVar4) {
    uVar7 = -(ulong)(1.0 < prepro->ub_);
    prepro->lb_ = (double)(~-(ulong)(prepro->lb_ < 0.0) & (ulong)prepro->lb_);
    prepro->ub_ = (double)(~uVar7 & (ulong)prepro->ub_ | uVar7 & 0x3ff0000000000000);
    prepro->type_ = INTEGER;
    this_00 = &(cc->
               super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>_>
               ).
               super_CustomConstraintData<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>,_std::array<int,_0UL>,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>_>
               .args_.super_LinTerms;
    LinTerms::sort_terms(this_00,true);
    if (*(cc->
         super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>_>
         ).
         super_CustomConstraintData<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>,_std::array<int,_0UL>,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>_>
         .args_.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
         super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr <= 0.0) {
      pcVar3 = (cc->
               super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>_>
               ).
               super_CustomConstraintData<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>,_std::array<int,_0UL>,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>_>
               .args_.super_BasicConstraint.name_._M_dataplus._M_p;
      local_2b8[0] = local_2a8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_2b8,pcVar3,
                 pcVar3 + (cc->
                          super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>_>
                          ).
                          super_CustomConstraintData<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>,_std::array<int,_0UL>,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>_>
                          .args_.super_BasicConstraint.name_._M_string_length);
      gch::detail::small_vector_base<std::allocator<double>,6u>::small_vector_base<6u>
                ((small_vector_base<std::allocator<double>,6u> *)&local_298,this_00);
      gch::detail::small_vector_base<std::allocator<int>,6u>::small_vector_base<6u>
                ((small_vector_base<std::allocator<int>,6u> *)&local_250,
                 &(cc->
                  super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>_>
                  ).
                  super_CustomConstraintData<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>,_std::array<int,_0UL>,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>_>
                  .args_.super_LinTerms.vars_);
      dVar1 = (cc->
              super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>_>
              ).
              super_CustomConstraintData<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>,_std::array<int,_0UL>,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>_>
              .args_.super_AlgConRhs<_1>.rhs_;
      if (local_288 != 0) {
        lVar6 = 0;
        do {
          *(ulong *)((long)local_298->m_data + lVar6) =
               *(ulong *)((long)local_298->m_data + lVar6) ^ 0x8000000000000000;
          lVar6 = lVar6 + 8;
        } while (local_288 << 3 != lVar6);
      }
      rr.rhs_ = dVar1 ^ 0x8000000000000000;
      local_220 = rr.rhs_;
      if (local_290 < 7) {
        local_218.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
        super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
             (ptr)&local_218.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
                   m_storage;
        local_218.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
        super_small_vector_data_base<double_*,_unsigned_long>.m_capacity = 6;
        if (local_288 != 0) {
          memcpy(local_218.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
                 super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,local_298,
                 local_288 * 8);
        }
      }
      else {
        local_218.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
        super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr = (ptr)local_298;
        local_218.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
        super_small_vector_data_base<double_*,_unsigned_long>.m_capacity = local_290;
        local_290 = 6;
        local_288 = 0;
        local_298 = &local_280;
      }
      if (local_248 < 7) {
        local_218.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
        super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
             (ptr)&local_218.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.m_storage
        ;
        local_218.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
        super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = 6;
        if (local_240 != 0) {
          memcpy(local_218.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                 super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,local_250,
                 local_240 * 4);
        }
      }
      else {
        local_218.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
        super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr = (ptr)local_250;
        local_218.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
        super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = local_248;
        local_248 = 6;
        local_240 = 0;
        local_250 = &local_238;
      }
      AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>::AlgebraicConstraint
                (&local_d0,&local_218,rr,true);
      ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>::
      ConditionalConstraint(&local_1a0,&local_d0);
      VVar5 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
              ::
              AssignResultVar2Args<mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<1>>>>
                        ((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
                          *)this,&local_1a0);
      prepro->result_var_ = VVar5;
      if (6 < local_1a0.
              super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>_>
              .
              super_CustomConstraintData<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>,_std::array<int,_0UL>,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>_>
              .args_.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
              super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
        operator_delete(local_1a0.
                        super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>_>
                        .
                        super_CustomConstraintData<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>,_std::array<int,_0UL>,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>_>
                        .args_.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>
                        .m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                        local_1a0.
                        super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>_>
                        .
                        super_CustomConstraintData<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>,_std::array<int,_0UL>,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>_>
                        .args_.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>
                        .m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
      }
      if (6 < local_1a0.
              super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>_>
              .
              super_CustomConstraintData<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>,_std::array<int,_0UL>,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>_>
              .args_.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.
              m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
        operator_delete(local_1a0.
                        super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>_>
                        .
                        super_CustomConstraintData<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>,_std::array<int,_0UL>,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>_>
                        .args_.super_LinTerms.coefs_.
                        super_small_vector_base<std::allocator<double>,_6U>.m_data.
                        super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                        local_1a0.
                        super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>_>
                        .
                        super_CustomConstraintData<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>,_std::array<int,_0UL>,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>_>
                        .args_.super_LinTerms.coefs_.
                        super_small_vector_base<std::allocator<double>,_6U>.m_data.
                        super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a0.
             super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>_>
             .
             super_CustomConstraintData<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>,_std::array<int,_0UL>,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>_>
             .args_.super_BasicConstraint.name_._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)((long)&local_1a0.
                     super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>_>
                     .
                     super_CustomConstraintData<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>,_std::array<int,_0UL>,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>_>
                     .args_.super_BasicConstraint.name_ + 0x10U)) {
        operator_delete(local_1a0.
                        super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>_>
                        .
                        super_CustomConstraintData<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>,_std::array<int,_0UL>,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>_>
                        .args_.super_BasicConstraint.name_._M_dataplus._M_p,
                        local_1a0.
                        super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>_>
                        .
                        super_CustomConstraintData<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>,_std::array<int,_0UL>,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>_>
                        .args_.super_BasicConstraint.name_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a0.
             super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>_>
             .super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus._M_p !=
          &local_1a0.
           super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>_>
           .super_FunctionalConstraint.super_BasicConstraint.name_.field_2) {
        operator_delete(local_1a0.
                        super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>_>
                        .super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus._M_p,
                        CONCAT44(local_1a0.
                                 super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>_>
                                 .super_FunctionalConstraint.super_BasicConstraint.name_.field_2.
                                 _M_allocated_capacity._4_4_,
                                 local_1a0.
                                 super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>_>
                                 .super_FunctionalConstraint.super_BasicConstraint.name_.field_2.
                                 _M_allocated_capacity._0_4_) + 1);
      }
      if (6 < local_d0.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
              super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
        operator_delete(local_d0.super_LinTerms.vars_.
                        super_small_vector_base<std::allocator<int>,_6U>.m_data.
                        super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                        local_d0.super_LinTerms.vars_.
                        super_small_vector_base<std::allocator<int>,_6U>.m_data.
                        super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
      }
      if (6 < local_d0.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.
              m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
        operator_delete(local_d0.super_LinTerms.coefs_.
                        super_small_vector_base<std::allocator<double>,_6U>.m_data.
                        super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                        local_d0.super_LinTerms.coefs_.
                        super_small_vector_base<std::allocator<double>,_6U>.m_data.
                        super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0.super_BasicConstraint.name_._M_dataplus._M_p !=
          &local_d0.super_BasicConstraint.name_.field_2) {
        operator_delete(local_d0.super_BasicConstraint.name_._M_dataplus._M_p,
                        local_d0.super_BasicConstraint.name_.field_2._M_allocated_capacity + 1);
      }
      if (6 < local_218.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
              super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
        operator_delete(local_218.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                        super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                        local_218.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                        super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
      }
      if (6 < local_218.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
              super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
        operator_delete(local_218.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
                        super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                        local_218.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
                        super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
      }
      if (6 < local_248) {
        operator_delete(local_250,local_248 << 2);
      }
      if (6 < local_290) {
        operator_delete(local_298,local_290 << 3);
      }
      if (local_2b8[0] != local_2a8) {
        operator_delete(local_2b8[0],local_2a8[0] + 1);
      }
    }
    else {
      dVar1 = (cc->
              super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>_>
              ).
              super_CustomConstraintData<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>,_std::array<int,_0UL>,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>_>
              .args_.super_AlgConRhs<_1>.rhs_;
      BoundComputations<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
      ::ComputeBoundsAndType
                ((PreprocessInfoStd *)&local_1a0,
                 (BoundComputations<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                  *)this,this_00);
      iVar2 = *(int *)(this + 0x2e8);
      if (((*(int *)(this + 0x2f4) != 0) && (iVar2 != 0)) &&
         (local_1a0.
          super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>_>
          .super_FunctionalConstraint.super_BasicConstraint.name_.field_2._M_allocated_capacity.
          _0_4_ == INTEGER)) {
        dVar9 = floor(dVar1);
        dVar10 = ceil(dVar1);
        if ((dVar9 != dVar10) || (NAN(dVar9) || NAN(dVar10))) {
          (cc->
          super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>_>
          ).
          super_CustomConstraintData<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>,_std::array<int,_0UL>,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>_>
          .args_.super_AlgConRhs<_1>.rhs_ = dVar9;
        }
      }
      if ((iVar2 != 0) && (*(int *)(this + 0x2f8) != 0)) {
        if ((double)local_1a0.
                    super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>_>
                    .super_FunctionalConstraint.super_BasicConstraint.name_._M_string_length <=
            dVar1) {
          dVar9 = 1.0;
        }
        else {
          dVar9 = 0.0;
          if ((double)local_1a0.
                      super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>_>
                      .super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus._M_p <=
              dVar1) {
            return;
          }
        }
        uVar7 = -(ulong)(prepro->lb_ < dVar9);
        uVar8 = -(ulong)(dVar9 < prepro->ub_);
        prepro->lb_ = (double)(~uVar7 & (ulong)prepro->lb_ | (ulong)dVar9 & uVar7);
        prepro->ub_ = (double)(~uVar8 & (ulong)prepro->ub_ | (ulong)dVar9 & uVar8);
      }
    }
  }
  return;
}

Assistant:

void PreprocessConstraint(
      ConditionalConstraint<
        AlgebraicConstraint< Body, AlgConRhs<kind> > >& cc,
      PreprocessInfo& prepro) {
    if (CheckEmptySubCon(cc, prepro))
      return;
    prepro.narrow_result_bounds(0.0, 1.0);
    prepro.set_result_type( var::INTEGER );
    assert(kind);
    auto& algc = cc.GetArguments();
    if (!IsNormalized(cc)) {
      auto arg1 = algc; // Add the normalized one instead
      arg1.negate();    // Negate the terms and sense
      prepro.set_result_var(
            MPD( AssignResultVar2Args(
                   ConditionalConstraint<
                     AlgebraicConstraint< Body, AlgConRhs<
                   -kind> > > { {
                   std::move(arg1.GetBody()), arg1.rhs()
                 } } ) ));
      return;
    }
    // See if we need to round the constant term
    auto rhs = algc.rhs();
    auto bnt = MPD(
          ComputeBoundsAndType(algc.GetBody()) );
    if (MPCD( IfPreproIneqRHS() )
        && var::INTEGER == bnt.get_result_type()
        && std::floor(rhs) != std::ceil(rhs)) {  // rhs not int
      if (1==kind)  // algc is >=
        algc.set_rhs( std::ceil(rhs) );
      else if (-1==kind)
        algc.set_rhs( std::floor(rhs) );
      else if (2==kind)  // algc is >
        algc.set_rhs( std::floor(rhs) ); // > floor(rhs)
      else {
        assert(-2==kind);
        algc.set_rhs( std::ceil(rhs) );
      }
    }
    // Decidable cases
    if (MPCD( IfPreproIneqResBounds() )) {
      if ((1==kind && bnt.lb()>=rhs)
          || (-1==kind && bnt.ub()<=rhs)
          || (2==kind && bnt.lb()>rhs)
          || (-2==kind && bnt.ub()<rhs)) {
        prepro.narrow_result_bounds(1.0, 1.0);   // TRUE
      } else {
        if ((1==kind && bnt.ub()<rhs)
            || (-1==kind && bnt.lb()>rhs)
            || (2==kind && bnt.ub()<=rhs)
            || (-2==kind && bnt.lb()>=rhs)) {
          prepro.narrow_result_bounds(0.0, 0.0);   // FALSE
        }
      }
    }
  }